

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O2

IterateResult __thiscall
gl4cts::DirectStateAccess::Framebuffers::CreationTest::iterate(CreationTest *this)

{
  ostringstream *poVar1;
  bool bVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  ContextType ctxType;
  deUint32 dVar6;
  undefined4 extraout_var;
  char *description;
  qpTestResult testResult;
  TestContext *this_00;
  GLuint i;
  long lVar8;
  GLuint framebuffers_dsa [2];
  GLuint framebuffers_legacy [2];
  undefined1 local_1b0 [384];
  long lVar7;
  
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar5);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::contextSupports(ctxType,(ApiType)0x154);
  bVar3 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_direct_state_access")
  ;
  if ((bVar2) || (bVar3)) {
    framebuffers_legacy[0] = 0;
    framebuffers_legacy[1] = 0;
    framebuffers_dsa[0] = 0;
    framebuffers_dsa[1] = 0;
    (**(code **)(lVar7 + 0x6d0))(2);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"glGenFramebuffers has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x6e);
    bVar2 = true;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
      cVar4 = (**(code **)(lVar7 + 0xc88))(framebuffers_legacy[lVar8]);
      if (cVar4 != '\0') {
        local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,
                        "GenFramebuffers has created default objects, but it should create only a names."
                       );
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        bVar2 = false;
      }
    }
    (**(code **)(lVar7 + 0x3c0))(2,framebuffers_dsa);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"glCreateFramebuffers has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x80);
    poVar1 = (ostringstream *)(local_1b0 + 8);
    for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
      cVar4 = (**(code **)(lVar7 + 0xc88))(framebuffers_dsa[lVar8]);
      if (cVar4 == '\0') {
        local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,"CreateFramebuffers has not created default objects.");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        bVar2 = false;
      }
    }
    for (lVar8 = 0; lVar8 != 8; lVar8 = lVar8 + 4) {
      if (*(int *)((long)framebuffers_legacy + lVar8) != 0) {
        (**(code **)(lVar7 + 0x440))(1);
        *(undefined4 *)((long)framebuffers_legacy + lVar8) = 0;
      }
      if (*(int *)((long)framebuffers_dsa + lVar8) != 0) {
        (**(code **)(lVar7 + 0x440))(1);
        *(undefined4 *)((long)framebuffers_dsa + lVar8) = 0;
      }
    }
    do {
      iVar5 = (**(code **)(lVar7 + 0x800))();
    } while (iVar5 != 0);
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if (bVar2) {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
    else {
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
  }
  else {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult CreationTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	/* Framebuffers' objects */
	static const glw::GLuint framebuffers_count = 2;

	glw::GLuint framebuffers_legacy[framebuffers_count] = {};
	glw::GLuint framebuffers_dsa[framebuffers_count]	= {};

	try
	{
		/* Check legacy state creation. */
		gl.genFramebuffers(framebuffers_count, framebuffers_legacy);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers has failed");

		for (glw::GLuint i = 0; i < framebuffers_count; ++i)
		{
			if (gl.isFramebuffer(framebuffers_legacy[i]))
			{
				is_ok = false;

				/* Log. */
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message
					<< "GenFramebuffers has created default objects, but it should create only a names."
					<< tcu::TestLog::EndMessage;
			}
		}

		/* Check direct state creation. */
		gl.createFramebuffers(framebuffers_count, framebuffers_dsa);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateFramebuffers has failed");

		for (glw::GLuint i = 0; i < framebuffers_count; ++i)
		{
			if (!gl.isFramebuffer(framebuffers_dsa[i]))
			{
				is_ok = false;

				/* Log. */
				m_context.getTestContext().getLog() << tcu::TestLog::Message
													<< "CreateFramebuffers has not created default objects."
													<< tcu::TestLog::EndMessage;
			}
		}
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Cleanup. */
	for (glw::GLuint i = 0; i < framebuffers_count; ++i)
	{
		if (framebuffers_legacy[i])
		{
			gl.deleteFramebuffers(1, &framebuffers_legacy[i]);

			framebuffers_legacy[i] = 0;
		}

		if (framebuffers_dsa[i])
		{
			gl.deleteFramebuffers(1, &framebuffers_dsa[i]);

			framebuffers_dsa[i] = 0;
		}
	}

	/* Errors clean up. */
	while (gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}